

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

void __thiscall soul::StructuralParser::parseProcessorInstance(StructuralParser *this,Graph *graph)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  ProcessorInstance *newInstance;
  UnqualifiedName *pUVar3;
  QualifiedIdentifier *pQVar4;
  Expression *pEVar5;
  long lVar6;
  undefined1 local_50 [32];
  UTF8Reader local_30;
  
  local_50._0_8_ = (this->super_SOULTokeniser).location.sourceCode.object;
  if ((SourceCodeText *)local_50._0_8_ != (SourceCodeText *)0x0) {
    (((SourceCodeText *)local_50._0_8_)->super_RefCountedObject).refCount =
         (((SourceCodeText *)local_50._0_8_)->super_RefCountedObject).refCount + 1;
  }
  local_50._8_8_ = (this->super_SOULTokeniser).location.location.data;
  local_50._16_8_ = this->currentScope;
  newInstance = PoolAllocator::allocate<soul::AST::ProcessorInstance,soul::AST::Context>
                          (&this->allocator->pool,(Context *)local_50);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_50._0_8_);
  pUVar3 = parseUnqualifiedName(this);
  (newInstance->instanceName).object = pUVar3;
  AST::Graph::addProcessorInstance(graph,newInstance);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27e59e);
  __s1 = (this->super_SOULTokeniser).currentType.text;
  if ((__s1 != "$identifier") &&
     ((__s1 == (char *)0x0 || (iVar2 = strcmp(__s1,"$identifier"), iVar2 != 0)))) {
    CompileMessageHelpers::createMessage<>
              ((CompileMessage *)local_50,syntax,error,"Expected a processor name");
    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,(CompileMessage *)local_50);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_30.data);
    if ((SourceCodeText *)local_50._0_8_ != (SourceCodeText *)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_,(ulong)(local_50._16_8_ + 1));
    }
  }
  pQVar4 = parseQualifiedIdentifier(this);
  (newInstance->targetProcessor).object = &pQVar4->super_Expression;
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a495b);
  if (bVar1) {
    pEVar5 = parseExpression(this,false);
    (newInstance->arraySize).object = pEVar5;
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27affb);
  }
  parseSpecialisationArgs((StructuralParser *)local_50);
  (newInstance->specialisationArgs).object = (Expression *)local_50._0_8_;
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a4758);
  lVar6 = 0x40;
  if (!bVar1) {
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27da09);
    lVar6 = 0x48;
    if (!bVar1) {
      return;
    }
  }
  pEVar5 = parseExpression(this,false);
  *(Expression **)((long)&(newInstance->super_ASTObject)._vptr_ASTObject + lVar6) = pEVar5;
  return;
}

Assistant:

void parseProcessorInstance (AST::Graph& graph)
    {
        auto& u = allocate<AST::ProcessorInstance> (getContext());
        u.instanceName = parseUnqualifiedName();
        graph.addProcessorInstance (u);

        expect (Operator::assign);

        if (! matches (Token::identifier))
            throwError (Errors::expectedProcessorName());

        u.targetProcessor = parseQualifiedIdentifier();

        // Array of processors
        if (matchIf (Operator::openBracket))
        {
            u.arraySize = parseExpression();
            expect (Operator::closeBracket);
        }

        // Parameterised
        u.specialisationArgs = parseSpecialisationArgs();

        // Clocked
        if (matchIf (Operator::times))
            u.clockMultiplierRatio = parseExpression();
        else if (matchIf (Operator::divide))
            u.clockDividerRatio = parseExpression();
    }